

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O3

vm_obj_id_t CVmObjTads::create_from_stack_intern(uchar **pc_ptr,uint argc,int is_transient)

{
  vm_val_t *pvVar1;
  vm_obj_id_t obj_id;
  int iVar2;
  CVmObjTads *self;
  vm_tadsobj_hdr *pvVar3;
  uchar *puVar4;
  uint argc_00;
  uint caller_ofs;
  uchar **ppuVar5;
  ulong unaff_R13;
  uint uVar6;
  vm_rcdesc *this;
  vm_obj_id_t srcobj;
  vm_val_t val;
  uchar *dummy_pc_ptr;
  vm_val_t id_val;
  vm_val_t srcobj_val;
  vm_rcdesc rc;
  vm_obj_id_t local_bc;
  undefined8 local_b8;
  anon_union_8_8_cb74652f_for_val aStack_b0;
  uchar **local_a8;
  uchar *local_a0;
  vm_val_t local_98;
  vm_val_t local_88;
  vm_rcdesc local_78;
  
  local_a8 = pc_ptr;
  if (argc == 0) {
    local_b8 = CONCAT44(local_b8._4_4_,1);
    argc_00 = 0;
    uVar6 = 1;
  }
  else {
    pvVar1 = sp_ + -1;
    local_b8 = *(undefined8 *)(sp_ + -1);
    aStack_b0 = sp_[-1].val;
    sp_ = pvVar1;
    if (((uint)local_b8 & 0xfffffffb) != 1) {
      err_throw(0x7e2);
    }
    unaff_R13 = (ulong)aStack_b0.ptr & 0xffffffff;
    if ((uint)local_b8 == 5 && aStack_b0._0_4_ == 0) {
      local_b8._4_4_ = (undefined4)((ulong)local_b8 >> 0x20);
      local_b8 = CONCAT44(local_b8._4_4_,1);
      uVar6 = 1;
    }
    else {
      uVar6 = (uint)local_b8;
      if (((uint)local_b8 != 1 && aStack_b0._0_4_ != 0) &&
         ((G_obj_table_X.pages_[(uint)aStack_b0._0_4_ >> 0xc][aStack_b0._0_4_ & 0xfff].field_0x14 &
          0x80) != 0)) {
        err_throw(0x7e1);
      }
    }
    argc_00 = argc - 1;
  }
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,0,1,0);
  if (is_transient != 0) {
    *(ushort *)&G_obj_table_X.pages_[obj_id >> 0xc][obj_id & 0xfff].field_0x14 =
         *(ushort *)&G_obj_table_X.pages_[obj_id >> 0xc][obj_id & 0xfff].field_0x14 | 0x80;
  }
  self = (CVmObjTads *)CVmObject::operator_new(0x10,obj_id);
  (self->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_003265a8;
  pvVar3 = vm_tadsobj_hdr::alloc(self,(ushort)(uVar6 != 1),0x10);
  (self->super_CVmObject).ext_ = (char *)pvVar3;
  if (uVar6 != 1) {
    pvVar3->sc[0].id = (uint)unaff_R13;
    *(char **)((self->super_CVmObject).ext_ + 0x30) =
         (G_obj_table_X.pages_[unaff_R13 >> 0xc & 0xfffff]->ptr_).obj_ +
         ((uint)unaff_R13 & 0xfff) * 0x18;
  }
  iVar2 = (*(self->super_CVmObject)._vptr_CVmObject[0xd])
                    (self,(ulong)G_predef_X.obj_construct,&local_b8,(ulong)obj_id,&local_bc,0);
  if (iVar2 == 0) {
    if (argc_00 != 0) {
      err_throw(0x899);
    }
    r0_.typ = VM_OBJ;
    r0_.val.obj = obj_id;
  }
  else {
    if (local_a8 == (uchar **)0x0) {
      this = &local_78;
      vm_rcdesc::init_ret(this,"TadsObject.construct");
      caller_ofs = 0;
      ppuVar5 = &local_a0;
    }
    else {
      caller_ofs = *(int *)local_a8 - (int)entry_ptr_native_;
      this = (vm_rcdesc *)0x0;
      ppuVar5 = local_a8;
    }
    local_88.typ = VM_OBJ;
    local_88.val.obj = local_bc;
    local_98.typ = VM_OBJ;
    local_98.val.obj = obj_id;
    puVar4 = CVmRun::get_prop(&G_interpreter_X,caller_ofs,&local_88,G_predef_X.obj_construct,
                              &local_98,argc_00,this);
    *ppuVar5 = puVar4;
  }
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjTads::create_from_stack_intern(
    VMG_ const uchar **pc_ptr, uint argc, int is_transient)
{
    vm_obj_id_t id;
    CVmObjTads *obj;
    vm_val_t val;
    vm_obj_id_t srcobj;

    /* check arguments */
    if (argc == 0)
    {
        /* no superclass argument - create a base object */
        val.set_nil();
    }
    else
    {
        /* 
         *   We have arguments.  The first is the superclass argument, which
         *   must be an object or nil.  Retrieve it and make sure it's
         *   valid.  
         */
        G_stk->pop(&val);
        if (val.typ != VM_OBJ && val.typ != VM_NIL)
            err_throw(VMERR_OBJ_VAL_REQD_SC);

        /* if it's the invalid object, treat it as nil */
        if (val.typ == VM_OBJ && val.val.obj == VM_INVALID_OBJ)
            val.set_nil();

        /* we cannot create an instance of a transient object */
        if (val.typ != VM_NIL
            && G_obj_table->is_obj_transient(val.val.obj))
            err_throw(VMERR_BAD_DYNAMIC_NEW);

        /* count the removal of the first argument */
        --argc;
    }

    /* 
     *   create the object - this type of construction is never used for
     *   root set objects 
     */
    id = vm_new_id(vmg_ FALSE, TRUE, FALSE);

    /* make the object transient if desired */
    if (is_transient)
        G_obj_table->set_obj_transient(id);

    /* 
     *   create a TADS object with the appropriate number of superclasses
     *   (0 if no superclass was specified, 1 if one was), and the default
     *   number of initial mutable properties 
     */
    obj = new (vmg_ id) CVmObjTads(vmg_ (val.typ == VM_NIL ? 0 : 1),
                                   VMTOBJ_PROP_INIT);

    /* set the object's superclass */
    if (val.typ != VM_NIL)
        obj->set_sc(vmg_ 0, val.val.obj);

    /* 
     *   Invoke the object's "construct" method, passing it the arguments
     *   that are still on the stack.  If the new object doesn't define or
     *   inherit the "construct" method, simply push the new object
     *   reference onto the stack directly.  
     */
    if (obj->get_prop(vmg_ G_predef->obj_construct, &val, id, &srcobj, 0))
    {
        vm_val_t srcobj_val;
        vm_val_t id_val;
        const uchar *dummy_pc_ptr;
        uint caller_ofs;
        vm_rcdesc rc, *rcp;
        
        /* use the null PC pointer if the caller didn't supply one */
        if (pc_ptr == 0)
        {
            /* there's no caller PC pointer - use a dummy value */
            pc_ptr = &dummy_pc_ptr;
            caller_ofs = 0;

            /* set up the recursive context */
            rcp = &rc;
            rc.init_ret(vmg_ "TadsObject.construct");
        }
        else
        {
            /* get the caller's offset */
            caller_ofs = G_interpreter->pc_to_method_ofs(*pc_ptr);
            rcp = 0;
        }

        /* 
         *   A "construct" method is defined - have the interpreter invoke
         *   it, which will set up the interpreter to start executing its
         *   byte-code.  This is all we need to do, since we assume and
         *   require that the constructor will return the new object as
         *   its return value when it's done.  
         */
        srcobj_val.set_obj(srcobj);
        id_val.set_obj(id);
        *pc_ptr = G_interpreter->get_prop(vmg_ caller_ofs, &srcobj_val,
                                          G_predef->obj_construct,
                                          &id_val, argc, rcp);
    }
    else
    {
        /* 
         *   there's no "construct" method defined - if we have any
         *   arguments, its an error 
         */
        if (argc != 0)
            err_throw(VMERR_WRONG_NUM_OF_ARGS);

        /* leave the new object value in R0 */
        G_interpreter->get_r0()->set_obj(id);
    }

    /* return the new object */
    return id;
}